

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                 (char *begin,char *end,
                 format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *handler)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_string_view<char> value_01;
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  basic_string_view<char> value_04;
  handle handle;
  handle handle_00;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  custom;
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  custom_00;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pbVar1;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this;
  long in_RDX;
  char *in_RSI;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this_00;
  long in_RDI;
  char c;
  id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  adapter;
  format_arg arg_1;
  format_arg arg;
  undefined2 in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc2;
  float in_stack_fffffffffffffdc4;
  bool bVar2;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
  *in_stack_fffffffffffffdc8;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
  *in_stack_fffffffffffffdd0;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *pdVar3;
  undefined2 in_stack_fffffffffffffdd8;
  undefined2 uVar4;
  undefined6 in_stack_fffffffffffffdda;
  undefined6 uVar5;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
  *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  char cVar6;
  char *in_stack_fffffffffffffdf8;
  format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined8 in_stack_fffffffffffffe30;
  long lVar7;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe3c;
  char *local_1b0;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_1a0;
  buffer<char> *local_180;
  char *local_178;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
  *p_Stack_170;
  uint local_168;
  char *local_158;
  undefined4 local_14c;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_140;
  buffer<char> *local_120;
  char *local_118;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
  *p_Stack_110;
  undefined4 local_108;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffff20;
  handle local_c8;
  basic_string_view<char> local_b8 [3];
  char **local_80;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_78;
  iterator local_70;
  handle local_58;
  basic_string_view<char> local_48 [3];
  char **local_18;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *local_10;
  iterator local_8;
  
  local_1b0 = (char *)(in_RDI + 1);
  if (local_1b0 == in_RSI) {
    error_handler::on_error
              ((error_handler *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  }
  if (*local_1b0 == '}') {
    format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::on_arg_id((format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)0x2676ef);
    this_00 = (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
               *)(in_RDX + 0x20);
    get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
              (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    local_140.out.container =
         (buffer<char> *)
         basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::out
                   (this_00);
    pbVar1 = basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
             args(this_00);
    local_140._8_8_ = *(undefined8 *)pbVar1;
    local_140._16_8_ = *(undefined8 *)(pbVar1 + 8);
    local_140.loc =
         basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
         locale(this_00);
    local_78 = &local_140;
    bVar2 = SUB41((uint)in_stack_fffffffffffffdc4 >> 0x18,0);
    local_80 = &local_118;
    switch(local_108) {
    case 0:
    default:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(local_78);
      break;
    case 1:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,(int)in_stack_fffffffffffffdc4);
      break;
    case 2:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,(uint)in_stack_fffffffffffffdc4);
      break;
    case 3:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,
                      CONCAT44(in_stack_fffffffffffffdc4,
                               CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
      break;
    case 4:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,
                      CONCAT44(in_stack_fffffffffffffdc4,
                               CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
      break;
    case 5:
      value._8_2_ = in_stack_fffffffffffffdd8;
      value._0_8_ = in_stack_fffffffffffffdd0;
      value._10_6_ = in_stack_fffffffffffffdda;
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffde8,(__int128)value);
      break;
    case 6:
      value_00._8_2_ = in_stack_fffffffffffffdd8;
      value_00._0_8_ = in_stack_fffffffffffffdd0;
      value_00._10_6_ = in_stack_fffffffffffffdda;
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffde8,(unsigned___int128)value_00);
      break;
    case 7:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,bVar2);
      break;
    case 8:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,bVar2);
      break;
    case 9:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
      break;
    case 10:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,
                      (double)CONCAT44(in_stack_fffffffffffffdc4,
                                       CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)
                                      ));
      break;
    case 0xb:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffde8,
                      (longdouble)CONCAT28(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0));
      break;
    case 0xc:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,
                      (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                       CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)
                                      ));
      break;
    case 0xd:
      basic_string_view<char>::basic_string_view(local_b8,local_118,(size_t)p_Stack_110);
      value_01.size_._0_2_ = in_stack_fffffffffffffdd8;
      value_01.data_ = (char *)in_stack_fffffffffffffdd0;
      value_01.size_._2_6_ = in_stack_fffffffffffffdda;
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,value_01);
      break;
    case 0xe:
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
           operator()(in_stack_fffffffffffffdc8,
                      (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                       CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)
                                      ));
      break;
    case 0xf:
      custom_00.format = p_Stack_110;
      custom_00.value = local_118;
      basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::handle::handle(&local_c8,custom_00);
      handle.custom_.format._0_4_ = in_stack_fffffffffffffe38;
      handle.custom_.value = (void *)in_stack_fffffffffffffe30;
      handle.custom_.format._4_4_ = in_stack_fffffffffffffe3c;
      local_70.container =
           (buffer<char> *)
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
           operator()((default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                       *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),handle);
    }
    local_120 = local_70.container;
    basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
    advance_to(this_00,local_70);
  }
  else if (*local_1b0 == '{') {
    format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::on_text(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
              (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  }
  else {
    uVar8 = 0;
    lVar7 = in_RDX;
    local_1b0 = parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&,char>&>
                          (in_stack_fffffffffffffdf8,
                           (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                           (id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
                            *)in_stack_fffffffffffffde8);
    if (local_1b0 == in_RSI) {
      cVar6 = '\0';
    }
    else {
      cVar6 = *local_1b0;
    }
    if (cVar6 == '}') {
      uVar4 = (undefined2)(in_RDX + 0x20);
      uVar5 = (undefined6)((ulong)(in_RDX + 0x20) >> 0x10);
      local_158 = local_1b0;
      local_14c = uVar8;
      get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
                (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
      local_1a0.out.container =
           (buffer<char> *)
           basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
           out((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                *)CONCAT62(uVar5,uVar4));
      pbVar1 = basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
               ::args((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                       *)CONCAT62(uVar5,uVar4));
      local_1a0._8_8_ = *(undefined8 *)pbVar1;
      local_1a0._16_8_ = *(undefined8 *)(pbVar1 + 8);
      local_1a0.loc =
           basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
           locale((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                   *)CONCAT62(uVar5,uVar4));
      pdVar3 = &local_1a0;
      this = (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)(ulong)local_168;
      bVar2 = SUB41((uint)in_stack_fffffffffffffdc4 >> 0x18,0);
      local_18 = &local_178;
      local_10 = pdVar3;
      switch(this) {
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x0:
      default:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(pdVar3);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x1:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,(int)in_stack_fffffffffffffdc4);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x2:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,(uint)in_stack_fffffffffffffdc4);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x3:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,
                        CONCAT44(in_stack_fffffffffffffdc4,
                                 CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x4:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,
                        CONCAT44(in_stack_fffffffffffffdc4,
                                 CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x5:
        value_02._8_2_ = uVar4;
        value_02._0_8_ = in_stack_fffffffffffffdd0;
        value_02._10_6_ = uVar5;
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(this,(__int128)value_02);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x6:
        value_03._8_2_ = uVar4;
        value_03._0_8_ = in_stack_fffffffffffffdd0;
        value_03._10_6_ = uVar5;
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(this,(unsigned___int128)value_03);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x7:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,bVar2);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x8:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,bVar2);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0x9:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xa:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,
                        (double)CONCAT44(in_stack_fffffffffffffdc4,
                                         CONCAT22(in_stack_fffffffffffffdc2,
                                                  in_stack_fffffffffffffdc0)));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xb:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(this,(longdouble)CONCAT28(uVar4,in_stack_fffffffffffffdd0));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xc:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,
                        (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                         CONCAT22(in_stack_fffffffffffffdc2,
                                                  in_stack_fffffffffffffdc0)));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xd:
        basic_string_view<char>::basic_string_view(local_48,local_178,(size_t)p_Stack_170);
        value_04.size_._0_2_ = uVar4;
        value_04.data_ = (char *)pdVar3;
        value_04.size_._2_6_ = uVar5;
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,value_04);
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xe:
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>::
             operator()(in_stack_fffffffffffffdc8,
                        (void *)CONCAT44(in_stack_fffffffffffffdc4,
                                         CONCAT22(in_stack_fffffffffffffdc2,
                                                  in_stack_fffffffffffffdc0)));
        break;
      case (default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *
           )0xf:
        custom.format = p_Stack_170;
        custom.value = local_178;
        basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
        ::handle::handle(&local_58,custom);
        handle_00.custom_.format._0_4_ = uVar8;
        handle_00.custom_.value = (void *)lVar7;
        handle_00.custom_.format._4_4_ = in_stack_fffffffffffffe3c;
        local_8.container =
             (buffer<char> *)
             default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
             ::operator()((default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                           *)CONCAT17(cVar6,in_stack_fffffffffffffe28),handle_00);
      }
      local_180 = local_8.container;
      basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
      advance_to((basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                  *)CONCAT62(uVar5,uVar4),local_8);
    }
    else {
      if (cVar6 != ':') {
        error_handler::on_error
                  ((error_handler *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      }
      local_1b0 = format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  ::on_format_specs(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                    in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if ((local_1b0 == in_RSI) || (*local_1b0 != '}')) {
        error_handler::on_error
                  ((error_handler *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      }
    }
  }
  return local_1b0 + 1;
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}